

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_suite.cpp
# Opt level: O2

void from_suite::convert_boolean(void)

{
  bool v;
  optional<bool> *in_RDX;
  undefined1 local_3c;
  undefined1 local_3b;
  optional<bool> value;
  variable result;
  
  value.super_type.m_initialized = true;
  value.super_type.m_storage = true;
  trial::dynamic::convert::
  into<trial::dynamic::basic_variable<std::allocator<char>>,boost::optional<bool>>
            (&result,(convert *)&value,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>(&result);
  boost::detail::test_impl
            ("result.is<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0x22,"void from_suite::convert_boolean()",v);
  local_3b = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>(&result);
  local_3c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0x23,"void from_suite::convert_boolean()",&local_3b,&local_3c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  return;
}

Assistant:

void convert_boolean()
{
    boost::optional<bool> value = true;
    variable result = convert::into<variable>(value);
    TRIAL_PROTOCOL_TEST(result.is<bool>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<bool>(), true);
}